

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

void __thiscall Clasp::UncoreMinimize::Todo::shrinkPush(Todo *this,UncoreMinimize *self,Solver *s)

{
  uint32 uVar1;
  uint uVar2;
  uint32 id;
  pointer pLVar3;
  bool bVar4;
  uint32 uVar5;
  long lVar6;
  
  uVar5 = 0;
  if (this->step_ < (this->core_).ebo_.size) {
    uVar5 = (this->core_).ebo_.buf[this->step_].id;
  }
  uVar1 = this->next_;
  if (uVar1 == 0) {
    return;
  }
  pLVar3 = (this->lits_).ebo_.buf;
  uVar2 = (this->lits_).ebo_.size;
  lVar6 = 0;
  while ((id = pLVar3[(ulong)uVar2 + lVar6 + -1].id, id == uVar5 ||
         (bVar4 = push(self,s,(Literal)(pLVar3[(ulong)uVar2 + lVar6 + -1].lit.rep_ & 0xfffffffe ^ 2)
                       ,id), bVar4))) {
    if (1 - uVar1 == (int)lVar6) {
      return;
    }
    lVar6 = lVar6 + -1;
  }
  return;
}

Assistant:

void UncoreMinimize::Todo::shrinkPush(UncoreMinimize& self, Solver& s) {
	const uint32 skip = step_ < sizeVec(core_) ? core_[step_].id : 0u;
	uint32 n = next_;
	for (Todo::const_iterator it = lits_.end(); n--;) {
		const LitPair& x = *--it;
		if (x.id != skip && !self.push(s, ~x.lit, x.id)) {
			break;
		}
	}
}